

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O0

int8_t sixbit_from_b64(base64_maps_t *maps,uchar b64letter)

{
  int *piVar1;
  int8_t ret;
  uchar b64letter_local;
  base64_maps_t *maps_local;
  
  maps_local._7_1_ = maps->decode_map[b64letter];
  if (maps_local._7_1_ == -1) {
    piVar1 = __errno_location();
    *piVar1 = 0x21;
    maps_local._7_1_ = -1;
  }
  return maps_local._7_1_;
}

Assistant:

static int8_t sixbit_from_b64(const base64_maps_t *maps,
			      const unsigned char b64letter)
{
	int8_t ret;

	ret = maps->decode_map[(unsigned char)b64letter];
	if (ret == (char)0xff) {
		errno = EDOM;
		return -1;
	}

	return ret;
}